

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.h
# Opt level: O3

void __thiscall cbtGImpactMeshShape::postUpdate(cbtGImpactMeshShape *this)

{
  long lVar1;
  
  for (lVar1 = (long)(this->m_mesh_parts).m_size; lVar1 != 0; lVar1 = lVar1 + -1) {
    (*((this->m_mesh_parts).m_data[lVar1 + -1]->super_cbtGImpactShapeInterface).
      super_cbtConcaveShape.super_cbtCollisionShape._vptr_cbtCollisionShape[0x12])();
  }
  (this->super_cbtGImpactShapeInterface).m_needs_update = true;
  return;
}

Assistant:

virtual void postUpdate()
	{
		int i = m_mesh_parts.size();
		while (i--)
		{
			cbtGImpactMeshShapePart* part = m_mesh_parts[i];
			part->postUpdate();
		}

		m_needs_update = true;
	}